

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeparser.cpp
# Opt level: O0

void __thiscall QMakeParser::putHashStr(QMakeParser *this,ushort **pTokPtr,ushort *buf,uint len)

{
  undefined2 *puVar1;
  size_t sVar2;
  uint in_ECX;
  void *in_RDX;
  long *in_RSI;
  ushort *tokPtr;
  size_t hash;
  undefined8 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  sVar2 = ProString::hash((QChar *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                          (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  puVar1 = (undefined2 *)*in_RSI;
  *puVar1 = (short)sVar2;
  puVar1[1] = (short)(sVar2 >> 0x10);
  puVar1[2] = (short)in_ECX;
  if (in_ECX != 0) {
    memcpy(puVar1 + 3,in_RDX,(ulong)(in_ECX << 1));
  }
  *in_RSI = (long)(puVar1 + 3 + in_ECX);
  return;
}

Assistant:

void QMakeParser::putHashStr(ushort *&pTokPtr, const ushort *buf, uint len)
{
    const size_t hash = ProString::hash((const QChar *)buf, len);
    ushort *tokPtr = pTokPtr;
    *tokPtr++ = (ushort)hash;
    *tokPtr++ = (ushort)(hash >> 16);
    *tokPtr++ = (ushort)len;
    if (len) // buf may be nullptr; don't pass that to memcpy (-> undefined behavior)
        memcpy(tokPtr, buf, len * 2);
    pTokPtr = tokPtr + len;
}